

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int execSqlF(sqlite3 *db,char **pzErrMsg,char *zSql,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_4c;
  undefined1 local_48 [4];
  int rc;
  va_list ap;
  char *z;
  char *zSql_local;
  char **pzErrMsg_local;
  sqlite3 *db_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  rc = 0x30;
  local_48 = (undefined1  [4])0x18;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  ap[0].reg_save_area = sqlite3VMPrintf(db,zSql,(__va_list_tag *)local_48);
  if ((char *)ap[0].reg_save_area == (char *)0x0) {
    db_local._4_4_ = 7;
  }
  else {
    local_4c = execSql(db,pzErrMsg,(char *)ap[0].reg_save_area);
    sqlite3DbFree(db,ap[0].reg_save_area);
    db_local._4_4_ = local_4c;
  }
  return db_local._4_4_;
}

Assistant:

static int execSqlF(sqlite3 *db, char **pzErrMsg, const char *zSql, ...){
  char *z;
  va_list ap;
  int rc;
  va_start(ap, zSql);
  z = sqlite3VMPrintf(db, zSql, ap);
  va_end(ap);
  if( z==0 ) return SQLITE_NOMEM;
  rc = execSql(db, pzErrMsg, z);
  sqlite3DbFree(db, z);
  return rc;
}